

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O3

bool tcu::floatThresholdCompare
               (TestLog *log,char *imageSetName,char *imageSetDesc,Vec4 *reference,
               ConstPixelBufferAccess *result,Vec4 *threshold,CompareLogMode logMode)

{
  int width;
  ChannelOrder CVar1;
  TextureFormat this;
  TextureFormat TVar2;
  ulong uVar3;
  TextureChannelClass TVar4;
  ulong uVar5;
  ConstPixelBufferAccess *access;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  ChannelOrder __fd;
  int iVar6;
  int y;
  int z;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  Vector<bool,_4> res;
  PixelBufferAccess errorMask;
  TextureLevel errorMaskStorage;
  Vec4 cmpPix;
  allocator<char> local_3fe;
  allocator<char> local_3fd;
  int local_3fc;
  Vec4 *local_3f8;
  int local_3ec;
  string local_3e8;
  string local_3c8;
  Vec4 local_3a8;
  Vec4 local_398;
  char *local_388;
  char *local_380;
  TextureFormat local_378;
  Vec4 *local_370;
  string local_368;
  Vector<float,_4> local_348;
  string local_338;
  string local_318;
  string local_2f8;
  LogImageSet local_2d8;
  undefined1 local_298 [8];
  size_type local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_288;
  _Alloc_hider local_278;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [6];
  ConstPixelBufferAccess local_208;
  TextureLevel local_1e0;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188 [4];
  ios_base local_140 [272];
  
  width = (result->m_size).m_data[0];
  local_3fc = (result->m_size).m_data[1];
  iVar6 = (result->m_size).m_data[2];
  local_1b8._0_4_ = RGB;
  local_1b8._4_4_ = UNORM_INT8;
  local_3f8 = threshold;
  local_388 = imageSetDesc;
  local_380 = imageSetName;
  local_378 = (TextureFormat)log;
  local_370 = reference;
  TextureLevel::TextureLevel(&local_1e0,(TextureFormat *)local_1b8,width,local_3fc,iVar6);
  TextureLevel::getAccess((PixelBufferAccess *)&local_208,&local_1e0);
  local_348.m_data[0] = 0.0;
  local_348.m_data[1] = 0.0;
  local_348.m_data[2] = 0.0;
  local_348.m_data[3] = 0.0;
  local_398.m_data[0] = 0.0;
  local_398.m_data[1] = 0.0;
  local_398.m_data[2] = 0.0;
  local_398.m_data[3] = 0.0;
  local_3a8.m_data[0] = 1.0;
  local_3a8.m_data[1] = 1.0;
  local_3a8.m_data[2] = 1.0;
  local_3a8.m_data[3] = 1.0;
  if (0 < iVar6) {
    z = 0;
    local_3ec = iVar6;
    do {
      if (0 < local_3fc) {
        iVar6 = 0;
        do {
          if (0 < width) {
            y = 0;
            do {
              ConstPixelBufferAccess::getPixel
                        ((ConstPixelBufferAccess *)local_1b8,(int)result,y,iVar6);
              fVar11 = local_370->m_data[0] - (float)local_1b8._0_4_;
              fVar12 = local_370->m_data[1] - (float)local_1b8._4_4_;
              fVar13 = local_370->m_data[2] - fStack_1b0;
              fVar14 = local_370->m_data[3] - fStack_1ac;
              auVar8._0_8_ = CONCAT44(fVar12,fVar11) ^ 0x8000000080000000;
              auVar8._8_4_ = -fVar13;
              auVar8._12_4_ = -fVar14;
              auVar9._4_4_ = fVar12;
              auVar9._0_4_ = fVar11;
              auVar9._8_4_ = fVar13;
              auVar9._12_4_ = fVar14;
              auVar9 = maxps(auVar8,auVar9);
              fVar11 = auVar9._0_4_;
              fVar12 = auVar9._4_4_;
              fVar13 = auVar9._8_4_;
              fVar14 = auVar9._12_4_;
              auVar15._4_4_ = -(uint)(fVar12 <= local_3f8->m_data[1]);
              auVar15._0_4_ = -(uint)(fVar11 <= local_3f8->m_data[0]);
              auVar15._8_4_ = -(uint)(fVar13 <= local_3f8->m_data[2]);
              auVar15._12_4_ = -(uint)(fVar14 <= local_3f8->m_data[3]);
              auVar9 = packssdw(auVar15,auVar15);
              auVar9 = packsswb(auVar9,auVar9);
              if ((byte)(auVar9[0] & DAT_00ae46a0) == 0) {
                bVar7 = false;
              }
              else {
                uVar3 = 0;
                do {
                  uVar5 = uVar3;
                  if (uVar5 == 3) break;
                  uVar3 = uVar5 + 1;
                } while (local_298[uVar5 + 1] != '\0');
                bVar7 = 2 < uVar5;
              }
              local_348.m_data[1] =
                   (float)(~-(uint)(fVar12 <= local_348.m_data[1]) & (uint)fVar12 |
                          (uint)local_348.m_data[1] & -(uint)(fVar12 <= local_348.m_data[1]));
              local_348.m_data[0] =
                   (float)(~-(uint)(fVar11 <= local_348.m_data[0]) & (uint)fVar11 |
                          (uint)local_348.m_data[0] & -(uint)(fVar11 <= local_348.m_data[0]));
              local_348.m_data[3] =
                   (float)(~-(uint)(fVar14 <= local_348.m_data[3]) & (uint)fVar14 |
                          (uint)local_348.m_data[3] & -(uint)(fVar14 <= local_348.m_data[3]));
              local_348.m_data[2] =
                   (float)(~-(uint)(fVar13 <= local_348.m_data[2]) & (uint)fVar13 |
                          (uint)local_348.m_data[2] & -(uint)(fVar13 <= local_348.m_data[2]));
              local_298._4_4_ = 0.0;
              if (bVar7) {
                local_298._0_4_ = 0.0;
                local_298._4_4_ = 1.0;
              }
              else {
                local_298._0_4_ = 1.0;
              }
              local_290 = 0x3f80000000000000;
              PixelBufferAccess::setPixel
                        ((PixelBufferAccess *)&local_208,(Vec4 *)local_298,y,iVar6,z);
              y = y + 1;
            } while (y != width);
          }
          iVar6 = iVar6 + 1;
        } while (iVar6 != local_3fc);
      }
      z = z + 1;
    } while (z != local_3ec);
  }
  this = local_378;
  auVar10._4_4_ = -(uint)(local_348.m_data[1] <= local_3f8->m_data[1]);
  auVar10._0_4_ = -(uint)(local_348.m_data[0] <= local_3f8->m_data[0]);
  auVar10._8_4_ = -(uint)(local_348.m_data[2] <= local_3f8->m_data[2]);
  auVar10._12_4_ = -(uint)(local_348.m_data[3] <= local_3f8->m_data[3]);
  auVar9 = packssdw(auVar10,auVar10);
  auVar9 = packsswb(auVar9,auVar9);
  CVar1 = auVar9._0_4_ & (ChannelOrder)DAT_00ae46a0;
  local_1b8._4_4_ = local_1b8._4_4_;
  local_1b8._0_4_ = CVar1;
  __fd = local_378.order;
  if ((char)CVar1 == '\0') {
    bVar7 = false;
LAB_00a80c70:
    TVar4 = getTextureChannelClass((result->m_format).type);
    if (TVar4 != TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      anon_unknown_50::computeScaleAndBias(result,result,&local_3a8,&local_398);
      TVar2 = local_378;
      local_378.order = this.order;
      local_378.type = this.type;
      local_1b8._0_4_ = local_378.order;
      local_1b8._4_4_ = local_378.type;
      local_378 = TVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_1b0,"Result image is normalized with formula p * ",0x2c);
      operator<<((ostream *)&fStack_1b0,&local_3a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&fStack_1b0," + ",3);
      operator<<((ostream *)&fStack_1b0,&local_398);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1b0);
      std::ios_base::~ios_base(local_140);
    }
    TVar2 = local_378;
    if (bVar7 == false) {
      local_378.order = this.order;
      local_378.type = this.type;
      local_1b8._0_4_ = local_378.order;
      local_1b8._4_4_ = local_378.type;
      local_378 = TVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&fStack_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_1b0,"Image comparison failed: max difference = ",0x2a);
      operator<<((ostream *)&fStack_1b0,&local_348);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_1b0,", threshold = ",0xe);
      operator<<((ostream *)&fStack_1b0,local_3f8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&fStack_1b0,", reference = ",0xe);
      operator<<((ostream *)&fStack_1b0,local_370);
      MessageBuilder::operator<<
                ((MessageBuilder *)local_1b8,(EndMessageToken *)&TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&fStack_1b0);
      std::ios_base::~ios_base(local_140);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_368,local_380,&local_3fd);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c8,local_388,&local_3fe);
    LogImageSet::LogImageSet(&local_2d8,&local_368,&local_3c8);
    TestLog::startImageSet
              ((TestLog *)this,local_2d8.m_name._M_dataplus._M_p,
               local_2d8.m_description._M_dataplus._M_p);
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"Result","");
    local_318._M_dataplus._M_p = (pointer)&local_318.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_318,"Result","");
    LogImage::LogImage((LogImage *)local_1b8,&local_3e8,&local_318,result,&local_3a8,&local_398,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_1b8,__fd,__buf_00,(size_t)result);
    local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"ErrorMask","");
    local_2f8._M_dataplus._M_p = (pointer)&local_2f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8,"Error mask","");
    access = &local_208;
    LogImage::LogImage((LogImage *)local_298,&local_338,&local_2f8,access,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_298,__fd,__buf_01,(size_t)access);
    TestLog::endImageSet((TestLog *)this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != local_268) {
      operator_delete(local_278._M_p,local_268[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_298._4_4_,local_298._0_4_) != &local_288) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_298._4_4_,local_298._0_4_),
                      local_288._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
      operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_338._M_dataplus._M_p != &local_338.field_2) {
      operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_318._M_dataplus._M_p != &local_318.field_2) {
      operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.m_description._M_dataplus._M_p != &local_2d8.m_description.field_2) {
      operator_delete(local_2d8.m_description._M_dataplus._M_p,
                      local_2d8.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.m_name._M_dataplus._M_p != &local_2d8.m_name.field_2) {
      operator_delete(local_2d8.m_name._M_dataplus._M_p,
                      local_2d8.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p == &local_368.field_2) goto LAB_00a810ce;
  }
  else {
    uVar3 = 0;
    do {
      uVar5 = uVar3;
      if (uVar5 == 3) break;
      uVar3 = uVar5 + 1;
    } while (local_1b8[uVar5 + 1] != '\0');
    bVar7 = 2 < uVar5;
    if (logMode == COMPARE_LOG_EVERYTHING || !bVar7) goto LAB_00a80c70;
    if (logMode != COMPARE_LOG_RESULT) goto LAB_00a810ce;
    if (((result->m_format).order != RGBA) || ((result->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(result,&local_3a8,&local_398);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d8,local_380,(allocator<char> *)&local_318);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_368,local_388,(allocator<char> *)&local_338);
    LogImageSet::LogImageSet((LogImageSet *)local_298,&local_2d8.m_name,&local_368);
    TestLog::startImageSet
              ((TestLog *)this,(char *)CONCAT44(local_298._4_4_,local_298._0_4_),local_278._M_p);
    local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3c8,"Result","");
    local_3e8._M_dataplus._M_p = (pointer)&local_3e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e8,"Result","");
    LogImage::LogImage((LogImage *)local_1b8,&local_3c8,&local_3e8,result,&local_3a8,&local_398,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)local_1b8,__fd,__buf,(size_t)result);
    TestLog::endImageSet((TestLog *)this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != local_188) {
      operator_delete(local_198._M_p,local_188[0]._M_allocated_capacity + 1);
    }
    if (local_1b8 != (undefined1  [8])&local_1a8) {
      operator_delete((void *)local_1b8,local_1a8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e8._M_dataplus._M_p != &local_3e8.field_2) {
      operator_delete(local_3e8._M_dataplus._M_p,local_3e8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
      operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_278._M_p != local_268) {
      operator_delete(local_278._M_p,local_268[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_298._4_4_,local_298._0_4_) != &local_288) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(local_298._4_4_,local_298._0_4_),
                      local_288._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != &local_368.field_2) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    local_368.field_2._M_allocated_capacity = local_2d8.m_name.field_2._M_allocated_capacity;
    local_368._M_dataplus._M_p = local_2d8.m_name._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8.m_name._M_dataplus._M_p == &local_2d8.m_name.field_2) goto LAB_00a810ce;
  }
  operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
LAB_00a810ce:
  TextureLevel::~TextureLevel(&local_1e0);
  return bVar7;
}

Assistant:

bool floatThresholdCompare (TestLog& log, const char* imageSetName, const char* imageSetDesc, const Vec4& reference, const ConstPixelBufferAccess& result, const Vec4& threshold, CompareLogMode logMode)
{
	const int			width				= result.getWidth();
	const int			height				= result.getHeight();
	const int			depth				= result.getDepth();

	TextureLevel		errorMaskStorage	(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), width, height, depth);
	PixelBufferAccess	errorMask			= errorMaskStorage.getAccess();
	Vec4				maxDiff				(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelBias			(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4				pixelScale			(1.0f, 1.0f, 1.0f, 1.0f);

	for (int z = 0; z < depth; z++)
	{
		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				const Vec4	cmpPix		= result.getPixel(x, y, z);
				const Vec4	diff		= abs(reference - cmpPix);
				const bool	isOk		= boolAll(lessThanEqual(diff, threshold));

				maxDiff = max(maxDiff, diff);

				errorMask.setPixel(isOk ? Vec4(0.0f, 1.0f, 0.0f, 1.0f) : Vec4(1.0f, 0.0f, 0.0f, 1.0f), x, y, z);
			}
		}
	}

	bool compareOk = boolAll(lessThanEqual(maxDiff, threshold));

	if (!compareOk || logMode == COMPARE_LOG_EVERYTHING)
	{
		// All formats except normalized unsigned fixed point ones need remapping in order to fit into unorm channels in logged images.
		if (tcu::getTextureChannelClass(result.getFormat().type) != tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT)
		{
			computeScaleAndBias(result, result, pixelScale, pixelBias);
			log << TestLog::Message << "Result image is normalized with formula p * " << pixelScale << " + " << pixelBias << TestLog::EndMessage;
		}

		if (!compareOk)
			log << TestLog::Message << "Image comparison failed: max difference = " << maxDiff << ", threshold = " << threshold << ", reference = " << reference << TestLog::EndMessage;

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::Image("ErrorMask",	"Error mask",	errorMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",		result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	return compareOk;
}